

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * __thiscall cmFileAPI::BuildReply(Value *__return_storage_ptr__,cmFileAPI *this,Query *q)

{
  cmFileAPI *pcVar1;
  pointer pbVar2;
  Value *pVVar3;
  Object *extraout_RDX;
  Object *extraout_RDX_00;
  Object *extraout_RDX_01;
  Object *o;
  cmFileAPI *this_00;
  pointer key;
  string local_a8;
  Query *local_88;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  this_00 = (cmFileAPI *)
            (q->Known).super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (cmFileAPI *)
           (q->Known).super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_88 = q;
  if (this_00 != pcVar1) {
    o = extraout_RDX;
    do {
      ObjectName_abi_cxx11_(&local_a8,this_00,o);
      pVVar3 = AddReplyIndexObject(this,(Object *)this_00);
      Json::Value::Value(&local_58,pVVar3);
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,&local_a8);
      Json::Value::operator=(pVVar3,&local_58);
      Json::Value::~Value(&local_58);
      o = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        o = extraout_RDX_01;
      }
      this_00 = (cmFileAPI *)&(this_00->APIv1)._M_string_length;
    } while (this_00 != pcVar1);
  }
  key = (local_88->Unknown).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (local_88->Unknown).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (key != pbVar2) {
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"unknown query file","");
      BuildReplyError(&local_80,&local_a8);
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,key);
      Json::Value::operator=(pVVar3,&local_80);
      Json::Value::~Value(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      key = key + 1;
    } while (key != pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReply(Query const& q)
{
  Json::Value reply = Json::objectValue;
  for (Object const& o : q.Known) {
    std::string const& name = ObjectName(o);
    reply[name] = this->AddReplyIndexObject(o);
  }

  for (std::string const& name : q.Unknown) {
    reply[name] = cmFileAPI::BuildReplyError("unknown query file");
  }
  return reply;
}